

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O3

void ircode_dump(void *_code)

{
  opcode_t oVar1;
  opcode_t oVar2;
  uint *puVar3;
  opcode_t *poVar4;
  byte bVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  
  puVar3 = *_code;
  uVar6 = (ulong)*puVar3;
  if (uVar6 == 0) {
    puts("NONE");
    return;
  }
  uVar7 = 0;
  do {
    poVar4 = *(opcode_t **)(*(long *)(puVar3 + 4) + uVar7 * 8);
    oVar1 = poVar4[1];
    if ((oVar1 != LOADAT) && (oVar1 != CALL)) {
      if (oVar1 != RET) {
        oVar1 = *poVar4;
        oVar2 = poVar4[3];
        bVar5 = opcode_numop(oVar1);
        uVar6 = (ulong)bVar5;
        if (oVar1 == SETLIST && oVar2 == RET0) {
          uVar6 = 2;
        }
        (*(code *)(&DAT_00144930 + *(int *)(&DAT_00144930 + uVar6 * 4)))();
        return;
      }
      printf("LABEL %d:\n",(ulong)poVar4[2]);
    }
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  return;
}

Assistant:

void ircode_dump (void *_code) {
    ircode_t    *code = (ircode_t *)_code;
    code_r      *list = code->list;
    uint32_t    count = ircode_count(code);

    if (count == 0) {
        printf("NONE\n");
        return;
    }

    for (uint32_t i=0, line=0; i<count; ++i) {
        inst_t      *inst = marray_get(*list, i);
        opcode_t    op = inst->op;
        int32_t     p1 = inst->p1;
        int32_t     p2 = inst->p2;
        int32_t     p3 = inst->p3;
        if (inst->tag == SKIP_TAG) continue;
        if (inst->tag == PRAGMA_MOVE_OPTIMIZATION) continue;
        if (inst->tag == LABEL_TAG) {printf("LABEL %d:\n", p1); continue;}

        uint8_t n = opcode_numop(op);
        if ((op == SETLIST) && (p2 == 0)) n = 2;
        
        // set to 1 to debug line number for each instruction
        #if 0
        printf("(%d)\t\t", inst->lineno);
        #endif
        
        switch (n) {
            case 0: {
                printf("%05d\t%s\n", line, opcode_name(op));
            }

            case 1: {
                printf("%05d\t%s %d\n", line, opcode_name(op), p1);
            } break;

            case 2: {
                if (op == LOADI) {
                    if (inst->tag == DOUBLE_TAG) printf("%05d\t%s %d %.2f\n", line, opcode_name(op), p1, inst->d);
                    #if defined(_WIN32)
                    else printf("%05d\t%s %d %I64d\n", line, opcode_name(op), p1, inst->n);
                    #else
                    else printf("%05d\t%s %d %"PRId64"\n", line, opcode_name(op), p1, inst->n);
                    #endif
                } else if (op == LOADK) {
                    if (p2 < CPOOL_INDEX_MAX) printf("%05d\t%s %d %d\n", line, opcode_name(op), p1, p2);
                    else printf("%05d\t%s %d %s\n", line, opcode_name(op), p1, opcode_constname(p2));
                } else {
                    printf("%05d\t%s %d %d\n", line, opcode_name(op), p1, p2);
                }
            } break;

            case 3: {
                printf("%05d\t%s %d %d %d\n", line, opcode_name(op), p1, p2, p3);
            } break;

            default: assert(0);
        }
        ++line;
    }
}